

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString>
               (JavascriptString *s,void *packedSubstringInfo,void *packedSubstringInfo2,
               CharCount appendCharLength,CompoundString *toString)

{
  int iVar1;
  Type *this;
  WriteBarrierPtr<void> *this_00;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  charcount_t cVar5;
  CharCount CVar6;
  undefined4 *puVar7;
  JavascriptString *ptr;
  uint uVar8;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b7,"(s)","s");
    if (!bVar4) goto LAB_00a0a405;
    *puVar7 = 0;
  }
  if (packedSubstringInfo == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b8,"(packedSubstringInfo)","packedSubstringInfo");
    if (!bVar4) goto LAB_00a0a405;
    *puVar7 = 0;
  }
  cVar5 = JavascriptString::GetLength(s);
  if (cVar5 < appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b9,"(appendCharLength <= s->GetLength())",
                                "appendCharLength <= s->GetLength()");
    if (!bVar4) goto LAB_00a0a405;
    *puVar7 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ba,"(toString)","toString");
    if (!bVar4) goto LAB_00a0a405;
    *puVar7 = 0;
  }
  bVar4 = JavascriptString::IsFinalized((JavascriptString *)toString);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bb,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar4) goto LAB_00a0a405;
    *puVar7 = 0;
  }
  if (toString->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bc,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar4) goto LAB_00a0a405;
    *puVar7 = 0;
  }
  if (toString->directCharLength == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bd,"(!toString->HasOnlyDirectChars())",
                                "!toString->HasOnlyDirectChars()");
    if (!bVar4) {
LAB_00a0a405:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this = &toString->lastBlockInfo;
  CVar6 = BlockInfo::PointerLength(this);
  iVar1 = -(uint)(packedSubstringInfo2 == (void *)0x0) + 2;
  uVar8 = ((toString->lastBlockInfo).charCapacity >> 2) - iVar1;
  if (CVar6 < uVar8) {
    pvVar2 = (this->buffer).ptr;
    ptr = GetImmutableOrScriptUnreferencedString(s);
    this_00 = (WriteBarrierPtr<void> *)((long)pvVar2 + (ulong)CVar6 * 8);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_00,ptr);
    if (packedSubstringInfo2 != (void *)0x0) {
      Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_00 + 1,packedSubstringInfo2);
    }
    Memory::WriteBarrierPtr<void>::WriteBarrierSet
              ((WriteBarrierPtr<void> *)((long)pvVar2 + (ulong)(iVar1 + CVar6) * 8),
               packedSubstringInfo);
    cVar5 = JavascriptString::GetLength((JavascriptString *)toString);
    JavascriptString::SetLength((JavascriptString *)toString,appendCharLength + cVar5);
    BlockInfo::SetPointerLength(this,-(uint)(packedSubstringInfo2 == (void *)0x0) + 3 + CVar6);
  }
  return CVar6 < uVar8;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        JavascriptString *const s,
        void *const packedSubstringInfo,
        void *const packedSubstringInfo2,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(packedSubstringInfo);
        Assert(appendCharLength <= s->GetLength());
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!toString->HasOnlyDirectChars());

        const CharCount blockPointerLength = toString->LastBlockPointerLength();
        const CharCount appendPointerLength = 2 + !!packedSubstringInfo2;
        if(blockPointerLength < toString->LastBlockPointerCapacity() - (appendPointerLength - 1))
        {
            Field(void*)* pointers = toString->LastBlockPointers();
            pointers[blockPointerLength] = GetImmutableOrScriptUnreferencedString(s);
            if(packedSubstringInfo2)
                pointers[blockPointerLength + 1] = packedSubstringInfo2;
            pointers[blockPointerLength + (appendPointerLength - 1)] = packedSubstringInfo;
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockPointerLength(blockPointerLength + appendPointerLength);
            return true;
        }
        return false;
    }